

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O0

uint __thiscall ThreadContext::ReleaseSourceDynamicProfileManagers(ThreadContext *this,WCHAR *url)

{
  RecyclableData *pRVar1;
  BaseDictionary<const_char16_t_*,_ThreadContext::SourceDynamicProfileManagerCache_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar2;
  SourceDynamicProfileManagerCache **ppSVar3;
  uint local_34;
  SourceDynamicProfileManagerCache *pSStack_30;
  uint refCount;
  SourceDynamicProfileManagerCache *local_28;
  SourceDynamicProfileManagerCache *managerCache;
  WCHAR *url_local;
  ThreadContext *this_local;
  
  managerCache = (SourceDynamicProfileManagerCache *)url;
  url_local = (WCHAR *)this;
  pRVar1 = Memory::RecyclerRootPtr::operator_cast_to_RecyclableData_
                     ((RecyclerRootPtr *)&this->recyclableData);
  if (pRVar1 == (RecyclableData *)0x0) {
    this_local._4_4_ = 0;
  }
  else {
    pRVar1 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                       (&this->recyclableData);
    pBVar2 = Memory::
             WriteBarrierPtr<JsUtil::BaseDictionary<const_char16_t_*,_ThreadContext::SourceDynamicProfileManagerCache_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
             ::operator->(&pRVar1->sourceProfileManagersByUrl);
    pSStack_30 = (SourceDynamicProfileManagerCache *)0x0;
    ppSVar3 = JsUtil::
              BaseDictionary<const_char16_t_*,_ThreadContext::SourceDynamicProfileManagerCache_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::Lookup(pBVar2,(char16_t **)&managerCache,&stack0xffffffffffffffd0);
    local_28 = *ppSVar3;
    local_34 = 0;
    if (local_28 != (SourceDynamicProfileManagerCache *)0x0) {
      local_34 = SourceDynamicProfileManagerCache::Release(local_28);
      if ((DAT_01ec73ca & 1) != 0) {
        Output::Trace(DynamicProfilePhase,L"Release dynamic source profile manger %d Url: %s\n",
                      (ulong)local_34,managerCache);
      }
      Output::Flush();
      if (local_34 == 0) {
        pRVar1 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                           (&this->recyclableData);
        pBVar2 = Memory::
                 WriteBarrierPtr<JsUtil::BaseDictionary<const_char16_t_*,_ThreadContext::SourceDynamicProfileManagerCache_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                 ::operator->(&pRVar1->sourceProfileManagersByUrl);
        JsUtil::
        BaseDictionary<const_char16_t_*,_ThreadContext::SourceDynamicProfileManagerCache_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        ::Remove(pBVar2,(char16_t **)&managerCache);
      }
    }
    this_local._4_4_ = local_34;
  }
  return this_local._4_4_;
}

Assistant:

uint ThreadContext::ReleaseSourceDynamicProfileManagers(const WCHAR* url)
{
    // If we've already freed the recyclable data, we're shutting down the thread context so skip clean up
    if (this->recyclableData == nullptr) return 0;

    SourceDynamicProfileManagerCache* managerCache = this->recyclableData->sourceProfileManagersByUrl->Lookup(url, nullptr);
    uint refCount = 0;
    if(managerCache)  // manager cache may be null we exceeded -INMEMORY_CACHE_MAX_URL
    {
        refCount = managerCache->Release();
        OUTPUT_VERBOSE_TRACE(Js::DynamicProfilePhase, _u("Release dynamic source profile manger %d Url: %s\n"), refCount, url);
        Output::Flush();
        if(refCount == 0)
        {
            this->recyclableData->sourceProfileManagersByUrl->Remove(url);
        }
    }
    return refCount;
}